

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall Lowerer::TryGenerateFastBrEq(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  AddrOpnd *pAVar6;
  undefined4 extraout_var_00;
  char *this_00;
  Lowerer *opnd;
  RegOpnd *opnd_00;
  
  OVar2 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar2 == OpndKindReg) {
    opnd_00 = (RegOpnd *)instr->m_src1;
    OVar2 = IR::Opnd::GetKind((Opnd *)opnd_00);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005c20a0;
      *puVar5 = 0;
    }
  }
  else {
    opnd_00 = (RegOpnd *)0x0;
  }
  this_00 = (char *)instr->m_src2;
  OVar2 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar2 == OpndKindReg) {
    opnd = (Lowerer *)instr->m_src2;
    this_00 = (char *)opnd;
    OVar2 = IR::Opnd::GetKind((Opnd *)opnd);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      this_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
      ;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005c20a0;
      *puVar5 = 0;
    }
  }
  else {
    opnd = (Lowerer *)0x0;
  }
  if (opnd_00 == (RegOpnd *)0x0) {
LAB_005c1f45:
    if (opnd != (Lowerer *)0x0) {
      bVar3 = IsNullOrUndefRegOpnd((Lowerer *)this_00,(RegOpnd *)opnd);
      if (bVar3) goto LAB_005c1f5e;
    }
    bVar3 = false;
  }
  else {
    bVar3 = IsNullOrUndefRegOpnd((Lowerer *)this_00,opnd_00);
    if (!bVar3) goto LAB_005c1f45;
    IR::Instr::SwapOpnds(instr);
LAB_005c1f5e:
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar3) goto LAB_005c20a0;
      *puVar5 = 0;
    }
    iVar4 = (**instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo)();
    pAVar6 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar4),AddrOpndKindDynamicVar,instr->m_func,
                               true,(Var)0x0);
    GenerateFastBrConst(this,(BranchInstr *)instr,&pAVar6->super_Opnd,true);
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar3) {
LAB_005c20a0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    iVar4 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
    pAVar6 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar4),AddrOpndKindDynamicVar,instr->m_func,
                               true,(Var)0x0);
    GenerateFastBrConst(this,(BranchInstr *)instr,&pAVar6->super_Opnd,true);
    IR::Instr::Remove(instr);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool
Lowerer::TryGenerateFastBrEq(IR::Instr * instr)
{
    IR::RegOpnd *srcReg1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *srcReg2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;

    bool isConst = false;
    if (srcReg1 && this->IsNullOrUndefRegOpnd(srcReg1))
    {
        instr->SwapOpnds();
        isConst = true;
    }

    // Fast path for == null or == undefined
    // if (src == null || src == undefined)
    if (isConst || (srcReg2 && this->IsNullOrUndefRegOpnd(srcReg2)))
    {
        IR::BranchInstr *newBranch;
        newBranch = this->GenerateFastBrConst(instr->AsBranchInstr(),
            this->LoadLibraryValueOpnd(instr, LibraryValue::ValueNull),
            true);

        this->GenerateFastBrConst(instr->AsBranchInstr(),
            this->LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined),
            true);

        instr->Remove();
        return true;
    }

    return false;
}